

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

MultiSampleState * __thiscall
vkt::Draw::PipelineCreateInfo::MultiSampleState::operator=
          (MultiSampleState *this,MultiSampleState *other)

{
  uint *__last;
  uint *__first;
  reference pvVar1;
  allocator<unsigned_int> local_39;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  ulong local_20;
  size_t sampleMaskArrayLen;
  MultiSampleState *other_local;
  MultiSampleState *this_local;
  
  (this->super_VkPipelineMultisampleStateCreateInfo).sType =
       (other->super_VkPipelineMultisampleStateCreateInfo).sType;
  (this->super_VkPipelineMultisampleStateCreateInfo).pNext =
       (other->super_VkPipelineMultisampleStateCreateInfo).pNext;
  (this->super_VkPipelineMultisampleStateCreateInfo).flags =
       (other->super_VkPipelineMultisampleStateCreateInfo).flags;
  (this->super_VkPipelineMultisampleStateCreateInfo).rasterizationSamples =
       (other->super_VkPipelineMultisampleStateCreateInfo).rasterizationSamples;
  (this->super_VkPipelineMultisampleStateCreateInfo).sampleShadingEnable =
       (other->super_VkPipelineMultisampleStateCreateInfo).sampleShadingEnable;
  (this->super_VkPipelineMultisampleStateCreateInfo).minSampleShading =
       (other->super_VkPipelineMultisampleStateCreateInfo).minSampleShading;
  local_20 = (ulong)(other->super_VkPipelineMultisampleStateCreateInfo).rasterizationSamples + 0x20
             >> 5;
  __first = (other->super_VkPipelineMultisampleStateCreateInfo).pSampleMask;
  __last = __first + local_20;
  sampleMaskArrayLen = (size_t)other;
  other_local = this;
  std::allocator<unsigned_int>::allocator(&local_39);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int_const*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_38,__first,__last,&local_39
            );
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&this->m_sampleMask,&local_38)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_38);
  std::allocator<unsigned_int>::~allocator(&local_39);
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->m_sampleMask,0);
  (this->super_VkPipelineMultisampleStateCreateInfo).pSampleMask = pvVar1;
  return this;
}

Assistant:

PipelineCreateInfo::MultiSampleState& PipelineCreateInfo::MultiSampleState::operator= (const MultiSampleState& other)
{
	sType = other.sType;
	pNext = other.pNext;
	flags					= other.flags;
	rasterizationSamples	= other.rasterizationSamples;
	sampleShadingEnable		= other.sampleShadingEnable;
	minSampleShading		= other.minSampleShading;

	const size_t sampleMaskArrayLen = (sizeof(vk::VkSampleMask) * 8 + other.rasterizationSamples) / (sizeof(vk::VkSampleMask) * 8);

	m_sampleMask	= std::vector<vk::VkSampleMask>(other.pSampleMask, other.pSampleMask + sampleMaskArrayLen);
	pSampleMask		= &m_sampleMask[0];

	return *this;
}